

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  initializer_list<std::pair<BigNum,_BigNum>_> __l;
  initializer_list<std::pair<BigNum,_BigNum>_> __l_00;
  initializer_list<std::pair<BigNum,_BigNum>_> __l_01;
  initializer_list<std::pair<BigNum,_BigNum>_> __l_02;
  double __x;
  double __x_00;
  double in_XMM1_Qa;
  pair<BigNum,_BigNum> *local_1350;
  pair<BigNum,_BigNum> *local_1328;
  pair<BigNum,_BigNum> *local_1300;
  pair<BigNum,_BigNum> *local_12d0;
  BigNum local_1290;
  BigNum local_1270;
  BigNum local_1250;
  BigNum local_1230;
  BigNum local_1210;
  BigNum local_11f0;
  allocator local_11c9;
  string local_11c8 [32];
  BigNum local_11a8;
  allocator local_1181;
  string local_1180 [32];
  BigNum local_1160;
  BigNum local_1140;
  BigNum local_1120;
  BigNum local_1100;
  BigNum local_10e0;
  BigNum local_10c0;
  BigNum local_10a0;
  allocator local_1079;
  string local_1078 [32];
  BigNum local_1058;
  allocator local_1031;
  string local_1030 [32];
  BigNum local_1010;
  BigNum local_ff0;
  BigNum local_fd0;
  BigNum local_fb0;
  BigNum local_f90;
  BigNum local_f70;
  BigNum local_f50;
  allocator local_f29;
  string local_f28 [32];
  BigNum local_f08;
  allocator local_ee1;
  string local_ee0 [32];
  BigNum local_ec0;
  BigNum local_ea0;
  BigNum local_e80;
  BigNum local_e60;
  BigNum local_e40;
  BigNum local_e20;
  BigNum local_e00;
  allocator local_dd9;
  string local_dd8 [32];
  BigNum local_db8;
  allocator local_d91;
  string local_d90 [32];
  BigNum local_d70;
  BigNum local_d50;
  BigNum local_d30;
  BigNum local_d10;
  BigNum local_cf0;
  BigNum local_cd0;
  BigNum local_cb0;
  undefined4 local_c90;
  allocator local_c89;
  int f;
  BigNum local_c68;
  allocator local_c41;
  string local_c40 [32];
  BigNum local_c20;
  BigNum local_c00;
  BigNum local_be0;
  BigNum local_bc0;
  BigNum local_ba0;
  BigNum local_b80;
  BigNum local_b60;
  BigNum local_b40;
  BigNum local_b20;
  BigNum local_b00;
  BigNum local_ae0;
  BigNum local_ac0;
  BigNum local_aa0;
  BigNum local_a80;
  BigNum local_a60;
  BigNum local_a40;
  BigNum local_a20;
  BigNum local_a00;
  BigNum local_9e0;
  BigNum local_9c0;
  BigNum local_9a0;
  BigNum local_980;
  BigNum local_960;
  BigNum local_940;
  BigNum local_920;
  BigNum local_900;
  vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> local_8e0;
  BigNum local_8c8;
  allocator<std::pair<BigNum,_BigNum>_> local_8a2;
  undefined1 local_8a1;
  BigNum local_8a0;
  BigNum local_880;
  BigNum local_860;
  BigNum local_840;
  pair<BigNum,_BigNum> *local_820;
  pair<BigNum,_BigNum> local_818;
  pair<BigNum,_BigNum> local_7d8;
  undefined1 local_798 [24];
  vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> test2;
  vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> local_750;
  BigNum local_738;
  allocator<std::pair<BigNum,_BigNum>_> local_712;
  undefined1 local_711;
  BigNum local_710;
  BigNum local_6f0;
  BigNum local_6d0;
  BigNum local_6b0;
  pair<BigNum,_BigNum> *local_690;
  pair<BigNum,_BigNum> local_688;
  pair<BigNum,_BigNum> local_648;
  undefined1 local_608 [24];
  vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> test1;
  vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> local_5c0;
  BigNum local_5a8;
  allocator<std::pair<BigNum,_BigNum>_> local_582;
  undefined1 local_581;
  BigNum local_580;
  BigNum local_560;
  BigNum local_540;
  BigNum local_520;
  BigNum local_500;
  BigNum local_4e0;
  pair<BigNum,_BigNum> *local_4c0;
  pair<BigNum,_BigNum> local_4b8;
  pair<BigNum,_BigNum> local_478;
  pair<BigNum,_BigNum> local_438;
  undefined1 local_3f8 [24];
  vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> test4;
  vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> local_3b0;
  BigNum local_398;
  allocator<std::pair<BigNum,_BigNum>_> local_372;
  undefined1 local_371;
  BigNum local_370;
  BigNum local_350;
  BigNum local_330;
  BigNum local_310;
  BigNum local_2f0;
  BigNum local_2d0;
  pair<BigNum,_BigNum> *local_2b0;
  pair<BigNum,_BigNum> local_2a8;
  pair<BigNum,_BigNum> local_268;
  pair<BigNum,_BigNum> local_228;
  undefined1 local_1e8 [24];
  vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> test;
  BigNum local_1a0;
  BigNum local_180;
  BigNum local_160;
  allocator local_139;
  string local_138 [32];
  BigNum local_118;
  allocator local_f1;
  string local_f0 [32];
  undefined1 local_d0 [8];
  BigNum c;
  string local_a8 [32];
  undefined1 local_88 [8];
  BigNum b;
  allocator local_51;
  string local_50 [32];
  undefined1 local_30 [8];
  BigNum a;
  
  a.sign = false;
  a._29_3_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"6",&local_51);
  BigNum::BigNum((BigNum *)local_30,(string *)local_50);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"2",(allocator *)&c.field_0x1f);
  BigNum::BigNum((BigNum *)local_88,(string *)local_a8);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&c.field_0x1f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"1234567827483828383893828238989938389893389",&local_f1);
  BigNum::BigNum((BigNum *)local_d0,(string *)local_f0);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,"123456798960569059",&local_139);
  BigNum::BigNum(&local_118,(string *)local_138);
  BigNum::operator=((BigNum *)local_88,&local_118);
  BigNum::~BigNum(&local_118);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  BigNum::BigNum(&local_180,(BigNum *)local_88);
  sqrt(__x);
  BigNum::operator=((BigNum *)local_d0,&local_160);
  BigNum::~BigNum(&local_160);
  BigNum::~BigNum(&local_180);
  std::operator<<((ostream *)&std::cout," sqrt ");
  BigNum::BigNum(&local_1a0,(BigNum *)local_88);
  print(&local_1a0);
  BigNum::~BigNum(&local_1a0);
  std::operator<<((ostream *)&std::cout," = ");
  BigNum::BigNum((BigNum *)
                 &test.
                  super__Vector_base<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(BigNum *)local_d0);
  print((BigNum *)
        &test.
         super__Vector_base<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage);
  BigNum::~BigNum((BigNum *)
                  &test.
                   super__Vector_base<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  local_371 = 1;
  local_2b0 = &local_2a8;
  BigNum::BigNum(&local_2d0,2);
  BigNum::BigNum(&local_2f0,5);
  std::pair<BigNum,_BigNum>::pair<BigNum,_BigNum,_true>(&local_2a8,&local_2d0,&local_2f0);
  local_2b0 = &local_268;
  BigNum::BigNum(&local_310,3);
  BigNum::BigNum(&local_330,7);
  std::pair<BigNum,_BigNum>::pair<BigNum,_BigNum,_true>(&local_268,&local_310,&local_330);
  local_2b0 = &local_228;
  BigNum::BigNum(&local_350,5);
  BigNum::BigNum(&local_370,0xb);
  std::pair<BigNum,_BigNum>::pair<BigNum,_BigNum,_true>(&local_228,&local_350,&local_370);
  local_371 = 0;
  local_1e8._0_8_ = &local_2a8;
  local_1e8._8_8_ = (pointer)0x3;
  std::allocator<std::pair<BigNum,_BigNum>_>::allocator(&local_372);
  __l_02._M_len = local_1e8._8_8_;
  __l_02._M_array = (iterator)local_1e8._0_8_;
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::vector
            ((vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> *)
             (local_1e8 + 0x10),__l_02,&local_372);
  std::allocator<std::pair<BigNum,_BigNum>_>::~allocator(&local_372);
  local_12d0 = (pair<BigNum,_BigNum> *)local_1e8;
  do {
    local_12d0 = local_12d0 + -1;
    std::pair<BigNum,_BigNum>::~pair(local_12d0);
  } while (local_12d0 != &local_2a8);
  BigNum::~BigNum(&local_370);
  BigNum::~BigNum(&local_350);
  BigNum::~BigNum(&local_330);
  BigNum::~BigNum(&local_310);
  BigNum::~BigNum(&local_2f0);
  BigNum::~BigNum(&local_2d0);
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::vector
            (&local_3b0,
             (vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> *)
             (local_1e8 + 0x10));
  solve_system(&local_398,&local_3b0);
  BigNum::operator=((BigNum *)local_d0,&local_398);
  BigNum::~BigNum(&local_398);
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::~vector
            (&local_3b0);
  std::operator<<((ostream *)&std::cout,"Result: ");
  BigNum::BigNum((BigNum *)
                 &test4.
                  super__Vector_base<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(BigNum *)local_d0);
  print((BigNum *)
        &test4.
         super__Vector_base<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage);
  BigNum::~BigNum((BigNum *)
                  &test4.
                   super__Vector_base<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  local_581 = 1;
  local_4c0 = &local_4b8;
  BigNum::BigNum(&local_4e0,5);
  BigNum::BigNum(&local_500,9);
  std::pair<BigNum,_BigNum>::pair<BigNum,_BigNum,_true>(&local_4b8,&local_4e0,&local_500);
  local_4c0 = &local_478;
  BigNum::BigNum(&local_520,7);
  BigNum::BigNum(&local_540,8);
  std::pair<BigNum,_BigNum>::pair<BigNum,_BigNum,_true>(&local_478,&local_520,&local_540);
  local_4c0 = &local_438;
  BigNum::BigNum(&local_560,3);
  BigNum::BigNum(&local_580,7);
  std::pair<BigNum,_BigNum>::pair<BigNum,_BigNum,_true>(&local_438,&local_560,&local_580);
  local_581 = 0;
  local_3f8._0_8_ = &local_4b8;
  local_3f8._8_8_ = (pointer)0x3;
  std::allocator<std::pair<BigNum,_BigNum>_>::allocator(&local_582);
  __l_01._M_len = local_3f8._8_8_;
  __l_01._M_array = (iterator)local_3f8._0_8_;
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::vector
            ((vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> *)
             (local_3f8 + 0x10),__l_01,&local_582);
  std::allocator<std::pair<BigNum,_BigNum>_>::~allocator(&local_582);
  local_1300 = (pair<BigNum,_BigNum> *)local_3f8;
  do {
    local_1300 = local_1300 + -1;
    std::pair<BigNum,_BigNum>::~pair(local_1300);
  } while (local_1300 != &local_4b8);
  BigNum::~BigNum(&local_580);
  BigNum::~BigNum(&local_560);
  BigNum::~BigNum(&local_540);
  BigNum::~BigNum(&local_520);
  BigNum::~BigNum(&local_500);
  BigNum::~BigNum(&local_4e0);
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::vector
            (&local_5c0,
             (vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> *)
             (local_3f8 + 0x10));
  solve_system(&local_5a8,&local_5c0);
  BigNum::operator=((BigNum *)local_d0,&local_5a8);
  BigNum::~BigNum(&local_5a8);
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::~vector
            (&local_5c0);
  std::operator<<((ostream *)&std::cout,"Result: ");
  BigNum::BigNum((BigNum *)
                 &test1.
                  super__Vector_base<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(BigNum *)local_d0);
  print((BigNum *)
        &test1.
         super__Vector_base<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage);
  BigNum::~BigNum((BigNum *)
                  &test1.
                   super__Vector_base<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  local_711 = 1;
  local_690 = &local_688;
  BigNum::BigNum(&local_6b0,1);
  BigNum::BigNum(&local_6d0,5);
  std::pair<BigNum,_BigNum>::pair<BigNum,_BigNum,_true>(&local_688,&local_6b0,&local_6d0);
  local_690 = &local_648;
  BigNum::BigNum(&local_6f0,2);
  BigNum::BigNum(&local_710,7);
  std::pair<BigNum,_BigNum>::pair<BigNum,_BigNum,_true>(&local_648,&local_6f0,&local_710);
  local_711 = 0;
  local_608._0_8_ = &local_688;
  local_608._8_8_ = (pointer)0x2;
  std::allocator<std::pair<BigNum,_BigNum>_>::allocator(&local_712);
  __l_00._M_len = local_608._8_8_;
  __l_00._M_array = (iterator)local_608._0_8_;
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::vector
            ((vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> *)
             (local_608 + 0x10),__l_00,&local_712);
  std::allocator<std::pair<BigNum,_BigNum>_>::~allocator(&local_712);
  local_1328 = (pair<BigNum,_BigNum> *)local_608;
  do {
    local_1328 = local_1328 + -1;
    std::pair<BigNum,_BigNum>::~pair(local_1328);
  } while (local_1328 != &local_688);
  BigNum::~BigNum(&local_710);
  BigNum::~BigNum(&local_6f0);
  BigNum::~BigNum(&local_6d0);
  BigNum::~BigNum(&local_6b0);
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::vector
            (&local_750,
             (vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> *)
             (local_608 + 0x10));
  solve_system(&local_738,&local_750);
  BigNum::operator=((BigNum *)local_d0,&local_738);
  BigNum::~BigNum(&local_738);
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::~vector
            (&local_750);
  std::operator<<((ostream *)&std::cout,"Result: ");
  BigNum::BigNum((BigNum *)
                 &test2.
                  super__Vector_base<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(BigNum *)local_d0);
  print((BigNum *)
        &test2.
         super__Vector_base<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage);
  BigNum::~BigNum((BigNum *)
                  &test2.
                   super__Vector_base<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  local_8a1 = 1;
  local_820 = &local_818;
  BigNum::BigNum(&local_840,0);
  BigNum::BigNum(&local_860,2);
  std::pair<BigNum,_BigNum>::pair<BigNum,_BigNum,_true>(&local_818,&local_840,&local_860);
  local_820 = &local_7d8;
  BigNum::BigNum(&local_880,0);
  BigNum::BigNum(&local_8a0,4);
  std::pair<BigNum,_BigNum>::pair<BigNum,_BigNum,_true>(&local_7d8,&local_880,&local_8a0);
  local_8a1 = 0;
  local_798._0_8_ = &local_818;
  local_798._8_8_ = (pointer)0x2;
  std::allocator<std::pair<BigNum,_BigNum>_>::allocator(&local_8a2);
  __l._M_len = local_798._8_8_;
  __l._M_array = (iterator)local_798._0_8_;
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::vector
            ((vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> *)
             (local_798 + 0x10),__l,&local_8a2);
  std::allocator<std::pair<BigNum,_BigNum>_>::~allocator(&local_8a2);
  local_1350 = (pair<BigNum,_BigNum> *)local_798;
  do {
    local_1350 = local_1350 + -1;
    std::pair<BigNum,_BigNum>::~pair(local_1350);
  } while (local_1350 != &local_818);
  BigNum::~BigNum(&local_8a0);
  BigNum::~BigNum(&local_880);
  BigNum::~BigNum(&local_860);
  BigNum::~BigNum(&local_840);
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::vector
            (&local_8e0,
             (vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> *)
             (local_798 + 0x10));
  solve_system(&local_8c8,&local_8e0);
  BigNum::operator=((BigNum *)local_d0,&local_8c8);
  BigNum::~BigNum(&local_8c8);
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::~vector
            (&local_8e0);
  std::operator<<((ostream *)&std::cout,"Result: ");
  BigNum::BigNum(&local_900,(BigNum *)local_d0);
  print(&local_900);
  BigNum::~BigNum(&local_900);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  BigNum::BigNum(&local_920,5);
  BigNum::operator=((BigNum *)local_30,&local_920);
  BigNum::~BigNum(&local_920);
  BigNum::BigNum(&local_940,0xd);
  BigNum::operator=((BigNum *)local_88,&local_940);
  BigNum::~BigNum(&local_940);
  BigNum::BigNum(&local_980,(BigNum *)local_30);
  BigNum::BigNum(&local_9a0,(BigNum *)local_88);
  reverseByMod(&local_960,&local_980,&local_9a0);
  BigNum::operator=((BigNum *)local_d0,&local_960);
  BigNum::~BigNum(&local_960);
  BigNum::~BigNum(&local_9a0);
  BigNum::~BigNum(&local_980);
  BigNum::BigNum(&local_9c0,(BigNum *)local_30);
  print(&local_9c0);
  BigNum::~BigNum(&local_9c0);
  std::operator<<((ostream *)&std::cout,"^(-1) (mod ");
  BigNum::BigNum(&local_9e0,(BigNum *)local_88);
  print(&local_9e0);
  BigNum::~BigNum(&local_9e0);
  std::operator<<((ostream *)&std::cout,") = ");
  BigNum::BigNum(&local_a00,(BigNum *)local_d0);
  print(&local_a00);
  BigNum::~BigNum(&local_a00);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  BigNum::BigNum(&local_a20,5);
  BigNum::operator=((BigNum *)local_30,&local_a20);
  BigNum::~BigNum(&local_a20);
  BigNum::BigNum(&local_a40,7);
  BigNum::operator=((BigNum *)local_88,&local_a40);
  BigNum::~BigNum(&local_a40);
  BigNum::BigNum(&local_a80,(BigNum *)local_30);
  BigNum::BigNum(&local_aa0,(BigNum *)local_88);
  reverseByMod(&local_a60,&local_a80,&local_aa0);
  BigNum::operator=((BigNum *)local_d0,&local_a60);
  BigNum::~BigNum(&local_a60);
  BigNum::~BigNum(&local_aa0);
  BigNum::~BigNum(&local_a80);
  BigNum::BigNum(&local_ac0,(BigNum *)local_30);
  print(&local_ac0);
  BigNum::~BigNum(&local_ac0);
  std::operator<<((ostream *)&std::cout,"^(-1) (mod ");
  BigNum::BigNum(&local_ae0,(BigNum *)local_88);
  print(&local_ae0);
  BigNum::~BigNum(&local_ae0);
  std::operator<<((ostream *)&std::cout,") = ");
  BigNum::BigNum(&local_b00,(BigNum *)local_d0);
  print(&local_b00);
  BigNum::~BigNum(&local_b00);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  BigNum::BigNum(&local_b20,0x47);
  BigNum::operator=((BigNum *)local_30,&local_b20);
  BigNum::~BigNum(&local_b20);
  BigNum::BigNum(&local_b40,0x5b);
  BigNum::operator=((BigNum *)local_88,&local_b40);
  BigNum::~BigNum(&local_b40);
  BigNum::BigNum(&local_b80,(BigNum *)local_30);
  BigNum::BigNum(&local_ba0,(BigNum *)local_88);
  reverseByMod(&local_b60,&local_b80,&local_ba0);
  BigNum::operator=((BigNum *)local_d0,&local_b60);
  BigNum::~BigNum(&local_b60);
  BigNum::~BigNum(&local_ba0);
  BigNum::~BigNum(&local_b80);
  BigNum::BigNum(&local_bc0,(BigNum *)local_30);
  print(&local_bc0);
  BigNum::~BigNum(&local_bc0);
  std::operator<<((ostream *)&std::cout,"^(-1) (mod ");
  BigNum::BigNum(&local_be0,(BigNum *)local_88);
  print(&local_be0);
  BigNum::~BigNum(&local_be0);
  std::operator<<((ostream *)&std::cout,") = ");
  BigNum::BigNum(&local_c00,(BigNum *)local_d0);
  print(&local_c00);
  BigNum::~BigNum(&local_c00);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c40,"12",&local_c41);
  BigNum::BigNum(&local_c20,(string *)local_c40);
  BigNum::operator=((BigNum *)local_30,&local_c20);
  BigNum::~BigNum(&local_c20);
  std::__cxx11::string::~string(local_c40);
  std::allocator<char>::~allocator((allocator<char> *)&local_c41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&f,"6",&local_c89);
  BigNum::BigNum(&local_c68,(string *)&f);
  BigNum::operator=((BigNum *)local_88,&local_c68);
  BigNum::~BigNum(&local_c68);
  std::__cxx11::string::~string((string *)&f);
  std::allocator<char>::~allocator((allocator<char> *)&local_c89);
  local_c90 = 10;
  BigNum::BigNum(&local_cd0,(BigNum *)local_30);
  BigNum::BigNum(&local_cf0,(BigNum *)local_88);
  operator/(&local_cb0,&local_cd0,&local_cf0);
  BigNum::operator=((BigNum *)local_d0,&local_cb0);
  BigNum::~BigNum(&local_cb0);
  BigNum::~BigNum(&local_cf0);
  BigNum::~BigNum(&local_cd0);
  BigNum::BigNum(&local_d10,(BigNum *)local_30);
  print(&local_d10);
  BigNum::~BigNum(&local_d10);
  std::operator<<((ostream *)&std::cout," / ");
  BigNum::BigNum(&local_d30,(BigNum *)local_88);
  print(&local_d30);
  BigNum::~BigNum(&local_d30);
  std::operator<<((ostream *)&std::cout," = ");
  BigNum::BigNum(&local_d50,(BigNum *)local_d0);
  print(&local_d50);
  BigNum::~BigNum(&local_d50);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d90,"3",&local_d91);
  BigNum::BigNum(&local_d70,(string *)local_d90);
  BigNum::operator=((BigNum *)local_30,&local_d70);
  BigNum::~BigNum(&local_d70);
  std::__cxx11::string::~string(local_d90);
  std::allocator<char>::~allocator((allocator<char> *)&local_d91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_dd8,"9",&local_dd9);
  BigNum::BigNum(&local_db8,(string *)local_dd8);
  BigNum::operator=((BigNum *)local_88,&local_db8);
  BigNum::~BigNum(&local_db8);
  std::__cxx11::string::~string(local_dd8);
  std::allocator<char>::~allocator((allocator<char> *)&local_dd9);
  BigNum::BigNum(&local_e20,(BigNum *)local_30);
  BigNum::BigNum(&local_e40,(BigNum *)local_88);
  pow(__x_00,in_XMM1_Qa);
  BigNum::operator=((BigNum *)local_d0,&local_e00);
  BigNum::~BigNum(&local_e00);
  BigNum::~BigNum(&local_e40);
  BigNum::~BigNum(&local_e20);
  BigNum::BigNum(&local_e60,(BigNum *)local_30);
  print(&local_e60);
  BigNum::~BigNum(&local_e60);
  std::operator<<((ostream *)&std::cout,"^");
  BigNum::BigNum(&local_e80,(BigNum *)local_88);
  print(&local_e80);
  BigNum::~BigNum(&local_e80);
  std::operator<<((ostream *)&std::cout," = ");
  BigNum::BigNum(&local_ea0,(BigNum *)local_d0);
  print(&local_ea0);
  BigNum::~BigNum(&local_ea0);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ee0,"400",&local_ee1);
  BigNum::BigNum(&local_ec0,(string *)local_ee0);
  BigNum::operator=((BigNum *)local_30,&local_ec0);
  BigNum::~BigNum(&local_ec0);
  std::__cxx11::string::~string(local_ee0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ee1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f28,"9",&local_f29);
  BigNum::BigNum(&local_f08,(string *)local_f28);
  BigNum::operator=((BigNum *)local_88,&local_f08);
  BigNum::~BigNum(&local_f08);
  std::__cxx11::string::~string(local_f28);
  std::allocator<char>::~allocator((allocator<char> *)&local_f29);
  BigNum::BigNum(&local_f70,(BigNum *)local_30);
  BigNum::BigNum(&local_f90,(BigNum *)local_88);
  operator+(&local_f50,&local_f70,&local_f90);
  BigNum::operator=((BigNum *)local_d0,&local_f50);
  BigNum::~BigNum(&local_f50);
  BigNum::~BigNum(&local_f90);
  BigNum::~BigNum(&local_f70);
  BigNum::BigNum(&local_fb0,(BigNum *)local_30);
  print(&local_fb0);
  BigNum::~BigNum(&local_fb0);
  std::operator<<((ostream *)&std::cout," + ");
  BigNum::BigNum(&local_fd0,(BigNum *)local_88);
  print(&local_fd0);
  BigNum::~BigNum(&local_fd0);
  std::operator<<((ostream *)&std::cout," = ");
  BigNum::BigNum(&local_ff0,(BigNum *)local_d0);
  print(&local_ff0);
  BigNum::~BigNum(&local_ff0);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1030,"64",&local_1031);
  BigNum::BigNum(&local_1010,(string *)local_1030);
  BigNum::operator=((BigNum *)local_30,&local_1010);
  BigNum::~BigNum(&local_1010);
  std::__cxx11::string::~string(local_1030);
  std::allocator<char>::~allocator((allocator<char> *)&local_1031);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1078,"64",&local_1079);
  BigNum::BigNum(&local_1058,(string *)local_1078);
  BigNum::operator=((BigNum *)local_88,&local_1058);
  BigNum::~BigNum(&local_1058);
  std::__cxx11::string::~string(local_1078);
  std::allocator<char>::~allocator((allocator<char> *)&local_1079);
  BigNum::BigNum(&local_10c0,(BigNum *)local_30);
  BigNum::BigNum(&local_10e0,(BigNum *)local_88);
  operator*(&local_10a0,&local_10c0,&local_10e0);
  BigNum::operator=((BigNum *)local_d0,&local_10a0);
  BigNum::~BigNum(&local_10a0);
  BigNum::~BigNum(&local_10e0);
  BigNum::~BigNum(&local_10c0);
  BigNum::BigNum(&local_1100,(BigNum *)local_30);
  print(&local_1100);
  BigNum::~BigNum(&local_1100);
  std::operator<<((ostream *)&std::cout," * ");
  BigNum::BigNum(&local_1120,(BigNum *)local_88);
  print(&local_1120);
  BigNum::~BigNum(&local_1120);
  std::operator<<((ostream *)&std::cout," = ");
  BigNum::BigNum(&local_1140,(BigNum *)local_d0);
  print(&local_1140);
  BigNum::~BigNum(&local_1140);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1180,"4096",&local_1181);
  BigNum::BigNum(&local_1160,(string *)local_1180);
  BigNum::operator=((BigNum *)local_30,&local_1160);
  BigNum::~BigNum(&local_1160);
  std::__cxx11::string::~string(local_1180);
  std::allocator<char>::~allocator((allocator<char> *)&local_1181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_11c8,"4",&local_11c9);
  BigNum::BigNum(&local_11a8,(string *)local_11c8);
  BigNum::operator=((BigNum *)local_88,&local_11a8);
  BigNum::~BigNum(&local_11a8);
  std::__cxx11::string::~string(local_11c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_11c9);
  BigNum::BigNum(&local_1210,(BigNum *)local_30);
  BigNum::BigNum(&local_1230,(BigNum *)local_88);
  operator/(&local_11f0,&local_1210,&local_1230);
  BigNum::operator=((BigNum *)local_d0,&local_11f0);
  BigNum::~BigNum(&local_11f0);
  BigNum::~BigNum(&local_1230);
  BigNum::~BigNum(&local_1210);
  BigNum::BigNum(&local_1250,(BigNum *)local_30);
  print(&local_1250);
  BigNum::~BigNum(&local_1250);
  std::operator<<((ostream *)&std::cout," / ");
  BigNum::BigNum(&local_1270,(BigNum *)local_88);
  print(&local_1270);
  BigNum::~BigNum(&local_1270);
  std::operator<<((ostream *)&std::cout," = ");
  BigNum::BigNum(&local_1290,(BigNum *)local_d0);
  print(&local_1290);
  BigNum::~BigNum(&local_1290);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  a.sign = false;
  a._29_3_ = 0;
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::~vector
            ((vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> *)
             (local_798 + 0x10));
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::~vector
            ((vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> *)
             (local_608 + 0x10));
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::~vector
            ((vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> *)
             (local_3f8 + 0x10));
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::~vector
            ((vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> *)
             (local_1e8 + 0x10));
  BigNum::~BigNum((BigNum *)local_d0);
  BigNum::~BigNum((BigNum *)local_88);
  BigNum::~BigNum((BigNum *)local_30);
  return a._28_4_;
}

Assistant:

int main() {
    BigNum a = BigNum("6");
    BigNum b = BigNum("2");
    BigNum c = BigNum("1234567827483828383893828238989938389893389");

   // a = BigNum("4096");
    b = BigNum("123456798960569059");
    c =  sqrt(b);
   // print(a);
    cout << " sqrt ";
    print(b);
    cout << " = ";
    print(c);
    cout << endl;

    // solve_system(vector<std::pair<BigNum, BigNum>> equations)

    vector<std::pair<BigNum, BigNum>> test = {{BigNum(2), BigNum(5)},
                                              {BigNum(3), BigNum(7)},
                                              {BigNum(5), BigNum(11)}};
    c = solve_system(test);
    cout << "Result: ";
    print(c);
    cout << endl;

    vector<std::pair<BigNum, BigNum>> test4 = {{BigNum(5), BigNum(9)},
                                              {BigNum(7), BigNum(8)},
                                              {BigNum(3), BigNum(7)}};
    c = solve_system(test4);
    cout << "Result: ";
    print(c);
    cout << endl;
    vector<std::pair<BigNum, BigNum>> test1 = {{BigNum(1), BigNum(5)},
                                              {BigNum(2), BigNum(7)}};
    c = solve_system(test1);
    cout << "Result: ";
    print(c);
    cout << endl;

    vector<std::pair<BigNum, BigNum>> test2 = {{BigNum(0), BigNum(2)},
                                               {BigNum(0), BigNum(4)}};
    c = solve_system(test2);
    cout << "Result: ";
    print(c);
    cout << endl;

    a = BigNum(5);
    b = BigNum(13);
    c = reverseByMod(a, b);
    print(a);
    cout << "^(-1) (mod ";
    print(b);
    cout << ") = ";
    print(c);
    cout << endl;

    a = BigNum(5);
    b = BigNum(7);
    c = reverseByMod(a, b);
    print(a);
    cout << "^(-1) (mod ";
    print(b);
    cout << ") = ";
    print(c);
    cout << endl;

    a = BigNum(71);
    b = BigNum(91);
    c = reverseByMod(a, b);
    print(a);
    cout << "^(-1) (mod ";
    print(b);
    cout << ") = ";
    print(c);
    cout << endl;


    a = BigNum("12");
    b = BigNum("6");
    int f = 10;
    c = a / b;
    print(a);
    cout << " / ";
    print(b);
    cout << " = ";
    print(c);
    cout << endl;

    a = BigNum("3");
    b = BigNum("9");
    c = pow(a,b);
    print(a);
    cout << "^";
    print(b);
    cout << " = ";
    print(c);
    cout << endl;

    a = BigNum("400");
    b = BigNum("9");
    c = a + b;
    print(a);
    cout << " + ";
    print(b);
    cout << " = ";
    print(c);
    cout << endl;


    a = BigNum("64");
    b = BigNum("64");
    c = a * b;
    print(a);
    cout << " * ";
    print(b);
    cout << " = ";
    print(c);
    cout << endl;

    a = BigNum("4096");
    b = BigNum("4");
    c = a / b;
    print(a);
    cout << " / ";
    print(b);
    cout << " = ";
    print(c);
    cout << endl;


    return 0;
}